

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

void __thiscall
bloaty::wasm::ReadCodeSection
          (wasm *this,Section *section,IndexedNames *names,uint32_t num_imports,RangeSink *sink)

{
  size_t this_00;
  char *pcVar1;
  char *pcVar2;
  RangeSink *this_01;
  uint32_t uVar3;
  const_iterator cVar4;
  undefined4 in_register_0000000c;
  size_t off;
  DataSource source;
  uint __val;
  string_view sVar5;
  string_view data;
  string_view symbol;
  string_view name_00;
  string_view name_01;
  string name;
  string_view local_c8;
  uint32_t local_ac;
  RangeSink *local_a8;
  Section *local_a0;
  IndexedNames *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8 = (RangeSink *)CONCAT44(in_register_0000000c,num_imports);
  local_c8 = *(string_view *)(this + 0x38);
  local_a0 = section;
  local_98 = names;
  local_ac = ReadVarUInt32(&local_c8);
  for (__val = 0; sVar5 = local_c8, local_ac != __val; __val = __val + 1) {
    this_00 = local_c8._M_len;
    pcVar1 = local_c8._M_str;
    uVar3 = ReadVarUInt32(&local_c8);
    pcVar2 = local_c8._M_str;
    off = (size_t)(((int)local_c8._M_str - (int)sVar5._M_str) + uVar3);
    sVar5._M_str = (char *)0x0;
    sVar5._M_len = (size_t)pcVar1;
    sVar5 = StrictSubstr((bloaty *)this_00,sVar5,off,(size_t)sink);
    source = (DataSource)sink;
    sink = (RangeSink *)sVar5._M_len;
    data._M_str._0_4_ = uVar3;
    data._M_len = (size_t)pcVar2;
    data._M_str._4_4_ = 0;
    local_c8 = StrictSubstr((bloaty *)local_c8._M_len,data,off);
    local_90._M_dataplus._M_p._0_4_ = (int)local_98 + __val;
    cVar4 = std::
            _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)local_a0,(key_type_conflict *)&local_90);
    this_01 = local_a8;
    if (cVar4.
        super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_50,"func[",&local_70);
      std::operator+(&local_90,&local_50,"]");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      name_01._M_str._4_4_ = local_90._M_dataplus._M_p._4_4_;
      name_01._M_str._0_4_ = (int)local_90._M_dataplus._M_p;
      name_01._M_len = local_90._M_string_length;
      RangeSink::AddFileRange(local_a8,"wasm_function",name_01,sVar5);
    }
    else {
      symbol._M_str._0_4_ = local_a8->data_source_;
      symbol._M_len =
           *(undefined8 *)
            ((long)cVar4.
                   super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_cur + 0x10);
      symbol._M_str._4_4_ = 0;
      ItaniumDemangle_abi_cxx11_
                (&local_90,
                 *(bloaty **)
                  ((long)cVar4.
                         super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                         ._M_cur + 0x18),symbol,source);
      name_00._M_str._4_4_ = local_90._M_dataplus._M_p._4_4_;
      name_00._M_str._0_4_ = (int)local_90._M_dataplus._M_p;
      name_00._M_len = local_90._M_string_length;
      RangeSink::AddFileRange(this_01,"wasm_function",name_00,sVar5);
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void ReadCodeSection(const Section& section, const IndexedNames& names,
                     uint32_t num_imports, RangeSink* sink) {
  string_view data = section.contents;

  uint32_t count = ReadVarUInt32(&data);

  for (uint32_t i = 0; i < count; i++) {
    string_view func = data;
    uint32_t size = ReadVarUInt32(&data);
    uint32_t total_size = size + (data.data() - func.data());

    func = StrictSubstr(func, 0, total_size);
    data = StrictSubstr(data, size);

    auto iter = names.find(num_imports + i);

    if (iter == names.end()) {
      std::string name = "func[" + std::to_string(i) + "]";
      sink->AddFileRange("wasm_function", name, func);
    } else {
      sink->AddFileRange("wasm_function", ItaniumDemangle(iter->second, sink->data_source()), func);
    }
  }
}